

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O2

void __thiscall QStyleOptionTitleBar::~QStyleOptionTitleBar(QStyleOptionTitleBar *this)

{
  QIcon::~QIcon(&this->icon);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->text).d);
  QStyleOption::~QStyleOption((QStyleOption *)this);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QStyleOptionTitleBar : public QStyleOptionComplex
{
public:
    enum StyleOptionType { Type = SO_TitleBar };
    enum StyleOptionVersion { Version = 1 };

    QString text;
    QIcon icon;
    int titleBarState;
    Qt::WindowFlags titleBarFlags;

    QStyleOptionTitleBar();
    QStyleOptionTitleBar(const QStyleOptionTitleBar &other) : QStyleOptionComplex(Version, Type) { *this = other; }
    QStyleOptionTitleBar &operator=(const QStyleOptionTitleBar &) = default;

protected:
    QStyleOptionTitleBar(int version);
}